

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false>_>_>
::_reduce_by_G(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false>_>_>
               *this,Tmp_column *column,
              vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *chainsInH,Index currentIndex)

{
  ID_index IVar1;
  uint uVar2;
  Characteristic CVar3;
  Column_settings *pCVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  iterator __position;
  node_ptr plVar8;
  Column_support *pCVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> pVar10;
  Field_element coef;
  uint local_48;
  Index local_44;
  mapped_type *local_40;
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  *local_38;
  
  local_44 = currentIndex;
  local_40 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&this->matrix_,&local_44);
  IVar1 = (local_40->super_Chain_column_option).pivot_;
  if (IVar1 == 0xffffffff) {
LAB_00163f9f:
    uVar5 = 0;
  }
  else {
    plVar8 = (node_ptr)&local_40->column_;
    do {
      plVar8 = (((type *)&plVar8->next_)->data_).root_plus_size_.m_header.super_node.next_;
      if (plVar8 == (node_ptr)&local_40->column_) goto LAB_00163f9f;
    } while (*(ID_index *)&plVar8[1].next_ != IVar1);
    uVar5 = *(uint *)((long)&plVar8[-2].prev_ + 4);
  }
  pCVar4 = this->colSettings_;
  uVar2 = (pCVar4->operators).characteristic_;
  if (uVar2 <= uVar5) {
    uVar5 = uVar5 % uVar2;
  }
  local_48 = (pCVar4->operators).inverse_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar5];
  CVar3 = (pCVar4->operators).characteristic_;
  local_38 = (vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)chainsInH;
  lVar7 = std::_Rb_tree_decrement(&(column->_M_t)._M_impl.super__Rb_tree_header._M_header);
  persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
            (&pCVar4->operators,&local_48,CVar3 - *(int *)(lVar7 + 0x24));
  uVar5 = local_48;
  pCVar9 = &local_40->column_;
  plVar8 = (local_40->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  if (plVar8 != (node_ptr)pCVar9) {
    pCVar4 = this->colSettings_;
    do {
      local_44 = *(Index *)&plVar8[1].next_;
      pVar10 = std::
               _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
               ::_M_emplace_unique<unsigned_int,unsigned_int_const&>
                         ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                           *)column,&local_44,(uint *)((long)(plVar8 + 0xfffffffffffffffe) + 0xcU));
      __position._M_node = (_Base_ptr)pVar10.first._M_node;
      if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        uVar6 = *(uint *)((long)(plVar8 + 0xfffffffffffffffe) + 0xcU) * uVar5 +
                *(int *)&__position._M_node[1].field_0x4;
        uVar2 = (pCVar4->operators).characteristic_;
        if (uVar2 <= uVar6) {
          uVar6 = uVar6 % uVar2;
        }
        *(uint *)&__position._M_node[1].field_0x4 = uVar6;
        if (uVar6 == 0) {
          std::
          _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
          ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                              *)column,__position);
        }
      }
      else {
        persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
                  (&pCVar4->operators,(Element *)&__position._M_node[1].field_0x4,uVar5);
      }
      plVar8 = plVar8->next_;
    } while (plVar8 != (node_ptr)pCVar9);
  }
  local_44 = (local_40->super_Chain_column_option).pairedColumn_;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::emplace_back<unsigned_int,unsigned_int&>(local_38,&local_44,&local_48);
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_reduce_by_G(Tmp_column& column,
                                                      std::vector<Entry_representative>& chainsInH,
                                                      Index currentIndex)
{
  Column& col = get_column(currentIndex);
  if constexpr (Master_matrix::Option_list::is_z2) {
    _add_to(col, column, 1u);                           // Reduce with the column col_g
    chainsInH.push_back(col.get_paired_chain_index());  // keep the col_h with which col_g is paired
  } else {
    Field_element coef = col.get_pivot_value();
    auto& operators = colSettings_->operators;
    coef = operators.get_inverse(coef);
    operators.multiply_inplace(coef, operators.get_characteristic() - column.rbegin()->second);

    _add_to(col, column, coef);                                       // Reduce with the column col_g
    chainsInH.emplace_back(col.get_paired_chain_index(), coef); // keep the col_h with which col_g is paired
  }
}